

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O2

void test_requirements<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>>(void)

{
  lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> lk;
  basic_shared_timed_mutex<yamc::rwlock::TaskFairness> mtx;
  unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> local_a8;
  shared_mutex_base<yamc::rwlock::TaskFairness> local_98;
  
  yamc::fair::detail::shared_mutex_base<yamc::rwlock::TaskFairness>::shared_mutex_base(&local_98);
  local_a8._M_device = (mutex_type *)&local_98;
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::lock
            ((basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *)&local_98);
  std::lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~lock_guard
            ((lock_guard<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> *)
             &local_a8);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::unique_lock
            (&local_a8,(mutex_type *)&local_98);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            (&local_a8);
  local_a8._M_device = (mutex_type *)&local_98;
  local_a8._M_owns =
       yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::try_lock
                 ((basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *)&local_98);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            (&local_a8);
  std::condition_variable::~condition_variable(&local_98.cv_);
  return;
}

Assistant:

void test_requirements()
{
  Mutex mtx;
  // Mutex::lock(), unlock()
  {
    std::lock_guard<Mutex> lk(mtx);
  }
  {
    std::unique_lock<Mutex> lk(mtx);
  }
  // Mutex::try_lock()
  {
    std::unique_lock<Mutex> lk(mtx, std::try_to_lock);
  }
}